

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

int dynamic_valid(menu_conflict *m,int oid)

{
  void *local_20;
  menu_entry *entry;
  int oid_local;
  menu_conflict *m_local;
  
  local_20 = menu_priv(m);
  entry._4_4_ = oid;
  while( true ) {
    if (entry._4_4_ == 0) {
      return *(int *)((long)local_20 + 0xc);
    }
    local_20 = *(void **)((long)local_20 + 0x10);
    if (local_20 == (void *)0x0) break;
    entry._4_4_ = entry._4_4_ + -1;
  }
  __assert_fail("entry",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                ,0x3f9,"int dynamic_valid(struct menu *, int)");
}

Assistant:

static int dynamic_valid(struct menu *m, int oid)
{
	struct menu_entry *entry;

	for (entry = menu_priv(m); oid; oid--) {
		entry = entry->next;
		assert(entry);
	}

	return entry->valid;
}